

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

int Gia_ManClockDomainNum(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  pVVar2 = p->vRegClasses;
  iVar4 = 0;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    uVar1 = pVVar2->nSize;
    uVar5 = (ulong)uVar1;
    iVar4 = 0;
    if (uVar5 != 0) {
      piVar3 = pVVar2->pArray;
      iVar6 = *piVar3;
      if (1 < (int)uVar1) {
        uVar7 = 1;
        do {
          if (iVar6 <= piVar3[uVar7]) {
            iVar6 = piVar3[uVar7];
          }
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      if (0 < (int)uVar1) {
        uVar7 = 0;
        iVar8 = 0;
        do {
          iVar8 = iVar8 + (uint)(piVar3[uVar7] == 0);
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
        if (iVar8 != 0) {
          __assert_fail("Vec_IntCountEntry(p->vRegClasses, 0) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                        ,0x50,"int Gia_ManClockDomainNum(Gia_Man_t *)");
        }
      }
      if (0 < iVar6) {
        iVar4 = 0;
        iVar8 = 1;
        do {
          if (0 < (int)uVar1) {
            uVar7 = 0;
            iVar9 = 0;
            do {
              iVar9 = iVar9 + (uint)(pVVar2->pArray[uVar7] == iVar8);
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
            iVar4 = (iVar4 + 1) - (uint)(iVar9 == 0);
          }
          bVar10 = iVar8 != iVar6;
          iVar8 = iVar8 + 1;
        } while (bVar10);
      }
    }
  }
  return iVar4;
}

Assistant:

int Gia_ManClockDomainNum( Gia_Man_t * p )
{
    int i, nDoms, Count = 0;
    if ( p->vRegClasses == NULL )
        return 0;
    nDoms = Vec_IntFindMax(p->vRegClasses);
    assert( Vec_IntCountEntry(p->vRegClasses, 0) == 0 );
    for ( i = 1; i <= nDoms; i++ )
        if ( Vec_IntCountEntry(p->vRegClasses, i) > 0 )
            Count++;
    return Count;    
}